

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

InterpolationRange *
tcu::anon_unknown_3::calcTriangleInterpolationWeights
          (InterpolationRange *__return_storage_ptr__,Vec4 *p0,Vec4 *p1,Vec4 *p2,Vec2 *ndpixel)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float maxDividend;
  float maxDivisor;
  float minDivisor;
  Vec2 nd2;
  Vec2 nd1;
  Vector<float,_2> local_40;
  Vec2 nd0;
  
  nd1.m_data = *(float (*) [2])p0->m_data;
  tcu::operator/(&nd1,p0->m_data[3]);
  nd2.m_data = *(float (*) [2])p1->m_data;
  tcu::operator/(&nd2,p1->m_data[3]);
  local_40.m_data = *(float (*) [2])p2->m_data;
  tcu::operator/(&local_40,p2->m_data[3]);
  fVar1 = triangleArea(ndpixel,&nd1,&nd2);
  fVar2 = triangleArea(ndpixel,&nd2,&nd0);
  fVar3 = triangleArea(ndpixel,&nd0,&nd1);
  fVar4 = getMaxValueWithinError(fVar1,3);
  fVar5 = getMaxValueWithinError(fVar2,3);
  fVar6 = getMaxValueWithinError(fVar3,3);
  fVar1 = getMinValueWithinError(fVar1,3);
  fVar2 = getMinValueWithinError(fVar2,3);
  fVar3 = getMinValueWithinError(fVar3,3);
  fVar4 = (float)(~-(uint)(-6.1035156e-05 < fVar4) & (uint)fVar4 & -(uint)(fVar4 < 0.0) |
                 ~-(uint)(fVar4 < 0.0) & (uint)fVar4) / p0->m_data[3];
  fVar4 = getMaxValueWithinError
                    ((float)(~-(uint)(-6.1035156e-05 < fVar4) & (uint)fVar4 & -(uint)(fVar4 < 0.0) |
                            ~-(uint)(fVar4 < 0.0) & (uint)fVar4),8);
  fVar5 = (float)(~-(uint)(-6.1035156e-05 < fVar5) & (uint)fVar5 & -(uint)(fVar5 < 0.0) |
                 ~-(uint)(fVar5 < 0.0) & (uint)fVar5) / p1->m_data[3];
  fVar5 = getMaxValueWithinError
                    ((float)(~-(uint)(-6.1035156e-05 < fVar5) & (uint)fVar5 & -(uint)(fVar5 < 0.0) |
                            ~-(uint)(fVar5 < 0.0) & (uint)fVar5),8);
  fVar4 = (float)(~-(uint)(fVar4 < 0.0 && -6.1035156e-05 < fVar4) & (uint)fVar4);
  fVar5 = (float)(~-(uint)(fVar5 < 0.0 && -6.1035156e-05 < fVar5) & (uint)fVar5);
  fVar6 = (float)(~-(uint)(-6.1035156e-05 < fVar6) & (uint)fVar6 & -(uint)(fVar6 < 0.0) |
                 ~-(uint)(fVar6 < 0.0) & (uint)fVar6) / p2->m_data[3];
  fVar6 = getMaxValueWithinError
                    ((float)(~-(uint)(-6.1035156e-05 < fVar6) & (uint)fVar6 & -(uint)(fVar6 < 0.0) |
                            ~-(uint)(fVar6 < 0.0) & (uint)fVar6),8);
  maxDividend = (float)(~-(uint)(-6.1035156e-05 < fVar6) & (uint)fVar6 & -(uint)(fVar6 < 0.0) |
                       ~-(uint)(fVar6 < 0.0) & (uint)fVar6);
  fVar1 = (float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
                 ~-(uint)(0.0 < fVar1) & (uint)fVar1) / p0->m_data[3];
  fVar6 = getMinValueWithinError
                    ((float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
                            ~-(uint)(0.0 < fVar1) & (uint)fVar1),8);
  fVar1 = (float)(~-(uint)(fVar2 < 6.1035156e-05) & (uint)fVar2 & -(uint)(0.0 < fVar2) |
                 ~-(uint)(0.0 < fVar2) & (uint)fVar2) / p1->m_data[3];
  fVar1 = getMinValueWithinError
                    ((float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
                            ~-(uint)(0.0 < fVar1) & (uint)fVar1),8);
  fVar6 = (float)(~-(uint)(0.0 < fVar6 && fVar6 < 6.1035156e-05) & (uint)fVar6);
  fVar1 = (float)(~-(uint)(0.0 < fVar1 && fVar1 < 6.1035156e-05) & (uint)fVar1);
  fVar2 = (float)(~-(uint)(fVar3 < 6.1035156e-05) & (uint)fVar3 & -(uint)(0.0 < fVar3) |
                 ~-(uint)(0.0 < fVar3) & (uint)fVar3) / p2->m_data[3];
  fVar2 = getMinValueWithinError
                    ((float)(~-(uint)(fVar2 < 6.1035156e-05) & (uint)fVar2 & -(uint)(0.0 < fVar2) |
                            ~-(uint)(0.0 < fVar2) & (uint)fVar2),8);
  fVar3 = (float)(~-(uint)(fVar2 < 6.1035156e-05) & (uint)fVar2 & -(uint)(0.0 < fVar2) |
                 ~-(uint)(0.0 < fVar2) & (uint)fVar2);
  fVar2 = getMaxValueWithinError(fVar4 + fVar5 + maxDividend,2);
  maxDivisor = (float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
                      ~-(uint)(fVar2 < 0.0) & (uint)fVar2);
  fVar2 = getMinValueWithinError(fVar6 + fVar1 + fVar3,2);
  minDivisor = (float)(~-(uint)(fVar2 < 6.1035156e-05) & (uint)fVar2 & -(uint)(0.0 < fVar2) |
                      ~-(uint)(0.0 < fVar2) & (uint)fVar2);
  InterpolationRange::InterpolationRange(__return_storage_ptr__);
  fVar2 = maximalRangeDivision(fVar6,fVar4,minDivisor,maxDivisor);
  fVar2 = getMaxValueWithinError
                    ((float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
                            ~-(uint)(fVar2 < 0.0) & (uint)fVar2),8);
  (__return_storage_ptr__->max).m_data[0] =
       (float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
              ~-(uint)(fVar2 < 0.0) & (uint)fVar2);
  fVar2 = maximalRangeDivision(fVar1,fVar5,minDivisor,maxDivisor);
  fVar2 = getMaxValueWithinError
                    ((float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
                            ~-(uint)(fVar2 < 0.0) & (uint)fVar2),8);
  (__return_storage_ptr__->max).m_data[1] =
       (float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
              ~-(uint)(fVar2 < 0.0) & (uint)fVar2);
  fVar2 = maximalRangeDivision(fVar3,maxDividend,minDivisor,maxDivisor);
  fVar2 = getMaxValueWithinError
                    ((float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
                            ~-(uint)(fVar2 < 0.0) & (uint)fVar2),8);
  (__return_storage_ptr__->max).m_data[2] =
       (float)(~-(uint)(-6.1035156e-05 < fVar2) & (uint)fVar2 & -(uint)(fVar2 < 0.0) |
              ~-(uint)(fVar2 < 0.0) & (uint)fVar2);
  fVar2 = minimalRangeDivision(fVar6,fVar4,minDivisor,maxDivisor);
  fVar2 = getMinValueWithinError
                    ((float)(~-(uint)(fVar2 < 6.1035156e-05) & (uint)fVar2 & -(uint)(0.0 < fVar2) |
                            ~-(uint)(0.0 < fVar2) & (uint)fVar2),8);
  (__return_storage_ptr__->min).m_data[0] =
       (float)(~-(uint)(fVar2 < 6.1035156e-05) & (uint)fVar2 & -(uint)(0.0 < fVar2) |
              ~-(uint)(0.0 < fVar2) & (uint)fVar2);
  fVar1 = minimalRangeDivision(fVar1,fVar5,minDivisor,maxDivisor);
  fVar1 = getMinValueWithinError
                    ((float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
                            ~-(uint)(0.0 < fVar1) & (uint)fVar1),8);
  (__return_storage_ptr__->min).m_data[1] =
       (float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
              ~-(uint)(0.0 < fVar1) & (uint)fVar1);
  fVar1 = minimalRangeDivision(fVar3,maxDividend,minDivisor,maxDivisor);
  fVar1 = getMinValueWithinError
                    ((float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
                            ~-(uint)(0.0 < fVar1) & (uint)fVar1),8);
  (__return_storage_ptr__->min).m_data[2] =
       (float)(~-(uint)(fVar1 < 6.1035156e-05) & (uint)fVar1 & -(uint)(0.0 < fVar1) |
              ~-(uint)(0.0 < fVar1) & (uint)fVar1);
  return __return_storage_ptr__;
}

Assistant:

InterpolationRange calcTriangleInterpolationWeights (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::Vec2& ndpixel)
{
	const int roundError		= 1;
	const int barycentricError	= 3;
	const int divError			= 8;

	const tcu::Vec2 nd0 = p0.swizzle(0, 1) / p0.w();
	const tcu::Vec2 nd1 = p1.swizzle(0, 1) / p1.w();
	const tcu::Vec2 nd2 = p2.swizzle(0, 1) / p2.w();

	const float ka = triangleArea(ndpixel, nd1, nd2);
	const float kb = triangleArea(ndpixel, nd2, nd0);
	const float kc = triangleArea(ndpixel, nd0, nd1);

	const float kaMax = getMaxFlushToZero(getMaxValueWithinError(ka, barycentricError));
	const float kbMax = getMaxFlushToZero(getMaxValueWithinError(kb, barycentricError));
	const float kcMax = getMaxFlushToZero(getMaxValueWithinError(kc, barycentricError));
	const float kaMin = getMinFlushToZero(getMinValueWithinError(ka, barycentricError));
	const float kbMin = getMinFlushToZero(getMinValueWithinError(kb, barycentricError));
	const float kcMin = getMinFlushToZero(getMinValueWithinError(kc, barycentricError));
	DE_ASSERT(kaMin <= kaMax);
	DE_ASSERT(kbMin <= kbMax);
	DE_ASSERT(kcMin <= kcMax);

	// calculate weights: vec3(ka / p0.w, kb / p1.w, kc / p2.w) / (ka / p0.w + kb / p1.w + kc / p2.w)
	const float maxPreDivisionValues[3] =
	{
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kaMax / p0.w()), divError)),
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kbMax / p1.w()), divError)),
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kcMax / p2.w()), divError)),
	};
	const float minPreDivisionValues[3] =
	{
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kaMin / p0.w()), divError)),
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kbMin / p1.w()), divError)),
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kcMin / p2.w()), divError)),
	};
	DE_ASSERT(minPreDivisionValues[0] <= maxPreDivisionValues[0]);
	DE_ASSERT(minPreDivisionValues[1] <= maxPreDivisionValues[1]);
	DE_ASSERT(minPreDivisionValues[2] <= maxPreDivisionValues[2]);

	const float maxDivisor = getMaxFlushToZero(getMaxValueWithinError(maxPreDivisionValues[0] + maxPreDivisionValues[1] + maxPreDivisionValues[2], 2*roundError));
	const float minDivisor = getMinFlushToZero(getMinValueWithinError(minPreDivisionValues[0] + minPreDivisionValues[1] + minPreDivisionValues[2], 2*roundError));
	DE_ASSERT(minDivisor <= maxDivisor);

	InterpolationRange returnValue;

	returnValue.max.x() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[0], maxPreDivisionValues[0], minDivisor, maxDivisor)), divError));
	returnValue.max.y() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[1], maxPreDivisionValues[1], minDivisor, maxDivisor)), divError));
	returnValue.max.z() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[2], maxPreDivisionValues[2], minDivisor, maxDivisor)), divError));
	returnValue.min.x() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[0], maxPreDivisionValues[0], minDivisor, maxDivisor)), divError));
	returnValue.min.y() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[1], maxPreDivisionValues[1], minDivisor, maxDivisor)), divError));
	returnValue.min.z() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[2], maxPreDivisionValues[2], minDivisor, maxDivisor)), divError));

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());
	DE_ASSERT(returnValue.min.z() <= returnValue.max.z());

	return returnValue;
}